

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffe54;
  uint32_t in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe64;
  uint32_t in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe6c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe78;
  uint32_t in_stack_fffffffffffffe7c;
  uint32_t in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe84;
  Image *in_stack_fffffffffffffe88;
  FunctionTask *in_stack_fffffffffffffe90;
  Image *in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffec0;
  uint32_t in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffed0;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  FunctionTask::Resize
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  FunctionTask::~FunctionTask((FunctionTask *)CONCAT44(in_stack_fffffffffffffe54,in_stack_00000008))
  ;
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        FunctionTask().Resize( in, startXIn, startYIn, widthIn, heightIn, out, startXOut, startYOut, widthOut, heightOut );
    }